

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerBase
          (TrackerBase *this,string *name,TrackerContext *ctx,ITracker *parent)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  ITracker *in_stack_ffffffffffffffd0;
  
  ITracker::ITracker(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__TrackerBase_001f0e98;
  std::__cxx11::string::string((string *)(in_RDI + 2),in_RSI);
  in_RDI[6] = in_RDX;
  in_RDI[7] = in_RCX;
  std::
  vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
  ::vector((vector<Catch::Ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<Catch::Ptr<Catch::TestCaseTracking::ITracker>_>_>
            *)0x190963);
  *(undefined4 *)(in_RDI + 0xb) = 0;
  return;
}

Assistant:

TrackerBase( std::string const& name, TrackerContext& ctx, ITracker* parent )
        :   m_name( name ),
            m_ctx( ctx ),
            m_parent( parent ),
            m_runState( NotStarted )
        {}